

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

Maybe<capnp::InterfaceSchema::Method> * __thiscall
capnp::InterfaceSchema::findMethodByName
          (Maybe<capnp::InterfaceSchema::Method> *__return_storage_ptr__,InterfaceSchema *this,
          StringPtr name,uint *counter)

{
  anon_union_64_1_a8c68091_for_NullableValue<capnp::InterfaceSchema::Method>_2 *paVar1;
  ushort uVar2;
  RawSchema *pRVar3;
  NullableValue<capnp::InterfaceSchema::Method> *pNVar4;
  InterfaceSchema IVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong __n;
  uint uVar9;
  CapTableReader *pCVar10;
  ReadLimiter *id;
  uint uVar11;
  unsigned_long i;
  long lVar12;
  uint32_t uVar13;
  bool bVar14;
  Reader RVar15;
  Reader superclass;
  Reader superclasses;
  undefined1 local_100 [24];
  SegmentReader *pSStack_e8;
  StructDataBitCount local_e0;
  ushort uStack_dc;
  undefined2 uStack_da;
  int iStack_d8;
  undefined4 uStack_d4;
  undefined4 local_d0;
  short sStack_cc;
  undefined2 uStack_ca;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined8 uStack_c0;
  uint *local_b8;
  RawSchema *local_b0;
  Schema local_a8;
  Schema local_a0;
  StructReader local_98;
  MethodList local_68;
  
  uVar7 = name.content.size_;
  uVar9 = *counter;
  *counter = uVar9 + 1;
  local_b8 = counter;
  if (uVar9 < 0x40) {
    pRVar3 = ((this->super_Schema).raw)->generic;
    getMethods(&local_68,this);
    uVar13 = pRVar3->memberCount;
    paVar1 = &(__return_storage_ptr__->ptr).field_1;
    uVar9 = 0;
    local_b0 = pRVar3;
    do {
      IVar5.super_Schema.raw = local_68.parent.super_Schema.raw;
      if (uVar13 <= uVar9) {
        (__return_storage_ptr__->ptr).isSet = false;
        break;
      }
      uVar2 = *(ushort *)((long)local_b0->membersByName + (ulong)(uVar9 + uVar13 & 0xfffffffe));
      _::ListReader::getStructElement
                ((StructReader *)(local_100 + 0x10),&local_68.list.reader,(uint)uVar2);
      local_100._0_8_ = IVar5.super_Schema.raw;
      if (sStack_cc == 0) {
        local_98.pointers._0_4_ = 0x7fffffff;
        local_98.capTable = (CapTableReader *)0x0;
        local_98.data = (void *)0x0;
        local_98.segment = (SegmentReader *)0x0;
      }
      else {
        local_98.data = (void *)CONCAT44(uStack_d4,iStack_d8);
        local_98.capTable = (CapTableReader *)pSStack_e8;
        local_98.segment = (SegmentReader *)local_100._16_8_;
        local_98.pointers._0_4_ = uStack_c8;
      }
      bVar14 = false;
      local_100._8_2_ = uVar2;
      RVar15 = _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_98,(void *)0x0,0);
      uVar8 = RVar15.super_StringPtr.content.size_;
      if (uVar8 == uVar7) {
        iVar6 = bcmp(RVar15.super_StringPtr.content.ptr,name.content.ptr,uVar8 - 1);
        bVar14 = iVar6 == 0;
      }
      if (bVar14) {
        (__return_storage_ptr__->ptr).isSet = true;
        pNVar4 = &__return_storage_ptr__->ptr;
        *(undefined4 *)((long)&pNVar4->field_1 + 0x30) = local_d0;
        *(short *)((long)&pNVar4->field_1 + 0x34) = sStack_cc;
        *(undefined2 *)((long)&pNVar4->field_1 + 0x36) = uStack_ca;
        *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.proto._reader.nestingLimit =
             CONCAT44(uStack_c4,uStack_c8);
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.data =
             (void *)CONCAT26(uStack_da,CONCAT24(uStack_dc,local_e0));
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers =
             (WirePointer *)CONCAT44(uStack_d4,iStack_d8);
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment =
             (SegmentReader *)local_100._16_8_;
        (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable =
             (CapTableReader *)pSStack_e8;
        (paVar1->value).parent.super_Schema.raw = (RawBrandedSchema *)local_100._0_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
             CONCAT62(local_100._10_6_,local_100._8_2_);
        uVar11 = uVar13;
      }
      else {
        __n = uVar7;
        if (uVar8 < uVar7) {
          __n = uVar8;
        }
        iVar6 = memcmp(RVar15.super_StringPtr.content.ptr,name.content.ptr,__n);
        uVar11 = uVar9 + uVar13 >> 1;
        if (iVar6 < 0 || iVar6 == 0 && uVar8 < uVar7) {
          uVar9 = uVar11 + 1;
          uVar11 = uVar13;
        }
      }
      uVar13 = uVar11;
    } while (!bVar14);
    if ((__return_storage_ptr__->ptr).isSet == false) {
      local_68.list.reader.capTable =
           (CapTableReader *)((this->super_Schema).raw)->generic->encodedNode;
      local_68.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
      local_68.list.reader.segment = (SegmentReader *)0x0;
      local_68.list.reader.ptr._0_4_ = 0x7fffffff;
      pCVar10 = (CapTableReader *)0x0;
      _::PointerReader::getStruct((StructReader *)local_100,(PointerReader *)&local_68,(word *)0x0);
      local_98.data = (ReadLimiter **)0x0;
      local_98.segment = (SegmentReader *)(RawBrandedSchema *)0x0;
      local_98.pointers._0_4_ = 0x7fffffff;
      if (4 < uStack_dc) {
        pCVar10 = (CapTableReader *)CONCAT62(local_100._10_6_,local_100._8_2_);
        local_98.data = &pSStack_e8->readLimiter;
        local_98.segment = (SegmentReader *)local_100._0_8_;
        local_98.pointers._0_4_ = iStack_d8;
      }
      local_98.capTable = pCVar10;
      _::PointerReader::getList
                ((ListReader *)&local_68,(PointerReader *)&local_98,INLINE_COMPOSITE,(word *)0x0);
      uVar7 = (ulong)(uint)local_68.list.reader.ptr;
      if (uVar7 != 0) {
        lVar12 = 0;
        do {
          _::ListReader::getStructElement(&local_98,(ListReader *)&local_68,(ElementCount)lVar12);
          if (local_98.dataSize < 0x40) {
            id = (ReadLimiter *)0x0;
          }
          else {
            id = *local_98.data;
          }
          local_a8 = Schema::getDependency
                               (&this->super_Schema,(uint64_t)id,(ElementCount)lVar12 | 0x4000000);
          local_a0.raw = (RawBrandedSchema *)Schema::asInterface(&local_a8);
          findMethodByName((Maybe<capnp::InterfaceSchema::Method> *)local_100,
                           (InterfaceSchema *)&local_a0,name,local_b8);
          if ((StructReader *)local_100 != (StructReader *)__return_storage_ptr__) {
            if ((__return_storage_ptr__->ptr).isSet == true) {
              (__return_storage_ptr__->ptr).isSet = false;
            }
            if (local_100[0] == '\x01') {
              pNVar4 = &__return_storage_ptr__->ptr;
              *(undefined4 *)((long)&pNVar4->field_1 + 0x30) = uStack_c8;
              *(short *)((long)&pNVar4->field_1 + 0x34) = (short)uStack_c4;
              *(short *)((long)&pNVar4->field_1 + 0x36) = (short)((uint)uStack_c4 >> 0x10);
              *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.proto._reader.nestingLimit
                   = uStack_c0;
              (__return_storage_ptr__->ptr).field_1.value.proto._reader.data =
                   (void *)CONCAT44(uStack_d4,iStack_d8);
              (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers =
                   (WirePointer *)CONCAT26(uStack_ca,CONCAT24(sStack_cc,local_d0));
              (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment = pSStack_e8;
              (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable =
                   (CapTableReader *)CONCAT26(uStack_da,CONCAT24(uStack_dc,local_e0));
              (paVar1->value).parent.super_Schema.raw =
                   (RawBrandedSchema *)CONCAT62(local_100._10_6_,local_100._8_2_);
              *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_100._16_8_;
              (__return_storage_ptr__->ptr).isSet = true;
            }
          }
        } while (((__return_storage_ptr__->ptr).isSet == false) &&
                (bVar14 = uVar7 - 1 != lVar12, lVar12 = lVar12 + 1, bVar14));
      }
    }
  }
  else {
    findMethodByName();
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<InterfaceSchema::Method> InterfaceSchema::findMethodByName(
    kj::StringPtr name, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return nullptr;
  }

  auto result = findSchemaMemberByName(raw->generic, name, getMethods());

  if (result == nullptr) {
    // Search superclasses.
    // TODO(perf):  This may be somewhat slow, and in the case of lots of diamond dependencies it
    //   could get pathological.  Arguably we should generate a flat list of transitive
    //   superclasses to search and store it in the RawSchema.  It's problematic, though, because
    //   this means that a dynamically-loaded RawSchema cannot be correctly constructed until all
    //   superclasses have been loaded, which imposes an ordering requirement on SchemaLoader or
    //   requires updating subclasses whenever a new superclass is loaded.
    auto superclasses = getProto().getInterface().getSuperclasses();
    for (auto i: kj::indices(superclasses)) {
      auto superclass = superclasses[i];
      uint location = _::RawBrandedSchema::makeDepLocation(
          _::RawBrandedSchema::DepKind::SUPERCLASS, i);
      result = getDependency(superclass.getId(), location)
          .asInterface().findMethodByName(name, counter);
      if (result != nullptr) {
        break;
      }
    }
  }

  return result;
}